

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

NULLCFuncPtr NULLC::FunctionRedirectPtr(NULLCRef r,NULLCArray *arr)

{
  uint uVar1;
  char *error;
  NULLCFuncPtr NVar2;
  
  if (arr == (NULLCArray *)0x0) {
    error = "ERROR: null pointer access";
LAB_0011dc3b:
    uVar1 = 0;
    nullcThrowError(error);
  }
  else {
    if (arr->len <= r.typeID) {
      error = "ERROR: type index is out of bounds of redirection table";
      goto LAB_0011dc3b;
    }
    uVar1 = *(uint *)(arr->ptr + (ulong)r.typeID * 4);
    if (uVar1 != 0) goto LAB_0011dc46;
  }
  r.ptr = (char *)0x0;
LAB_0011dc46:
  NVar2.id = uVar1;
  NVar2.context = r.ptr;
  return NVar2;
}

Assistant:

NULLCFuncPtr NULLC::FunctionRedirectPtr(NULLCRef r, NULLCArray* arr)
{
	NULLCFuncPtr ret = { 0, 0 };

	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}

	unsigned int *funcs = (unsigned int*)arr->ptr;

	if(r.typeID >= arr->len)
	{
		nullcThrowError("ERROR: type index is out of bounds of redirection table");
		return ret;
	}

	ret.context = funcs[r.typeID] ? r.ptr : 0;
	ret.id = funcs[r.typeID];

	return ret;
}